

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_control_main.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  adt_str_t *paVar2;
  adt_str_t *paVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  undefined8 uVar7;
  long lVar8;
  undefined8 uVar9;
  adt_str_t *paVar10;
  char *pcVar11;
  uint8_t addressFamily;
  int iVar12;
  undefined4 in_register_0000003c;
  uint16_t dummy_port;
  undefined1 local_2a [2];
  
  m_connect_port = 0x13ec;
  uVar5 = argparse_exec(CONCAT44(in_register_0000003c,argc),argv,argparse_cbk);
  if (uVar5 != 0) {
    printf("Error parsing argument (%d)\n",(ulong)uVar5);
    pcVar11 = *argv;
LAB_0010244c:
    iVar12 = 0;
    printf("%s [-i json_file] [-c --connect connect_path] [-p --port connect_port] [--version] [name value]\n"
           ,pcVar11);
    goto switchD_0010268f_default;
  }
  if (m_display_version == '\x01') {
    printf("%s %s\n","apx_control","0.3.1");
  }
  if (m_display_help == '\x01') {
LAB_00102440:
    pcVar11 = *argv;
    goto LAB_0010244c;
  }
  if ((m_connect_resource_type == '\0') &&
     ((m_connect_resource_type =
            apx_parse_resource_name("/tmp/apx_node.socket",&m_connect_address,local_2a),
      m_connect_resource_type == '\x05' || (m_connect_resource_type == '\0')))) {
    __assert_fail("(m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_control/src/apx_control_main.c"
                  ,0x81,"int main(int, char **)");
  }
  paVar3 = m_value;
  paVar2 = m_name;
  if (m_input_file_path == (adt_str_t *)0x0) {
    iVar12 = 0;
    if (m_name != (adt_str_t *)0x0) {
      if (m_value == (adt_str_t *)0x0) {
        puts("Error: missing value argument");
        goto LAB_00102440;
      }
      paVar10 = (adt_str_t *)adt_str_new();
      cVar4 = adt_str_push(paVar10,0x7b);
      iVar12 = -1;
      if ((((cVar4 != '\0') || (cVar4 = adt_str_push(paVar10,0x22), cVar4 != '\0')) ||
          (cVar4 = adt_str_append(paVar10,paVar2), cVar4 != '\0')) ||
         (((cVar4 = adt_str_push(paVar10,0x22), cVar4 != '\0' ||
           (cVar4 = adt_str_push(paVar10,0x3a), cVar4 != '\0')) ||
          ((cVar4 = adt_str_append(paVar10,paVar3), cVar4 != '\0' ||
           (cVar4 = adt_str_push(paVar10,0x7d), cVar4 != '\0')))))) goto switchD_0010268f_default;
      uVar7 = adt_str_cstr(paVar10);
      lVar8 = dtl_json_load_cstr(uVar7);
      if (lVar8 == 0) {
        main_cold_1();
        goto switchD_0010268f_default;
      }
      dtl_dv_dec_ref(lVar8);
      iVar12 = 0;
      m_message = paVar10;
    }
  }
  else {
    uVar7 = adt_str_cstr();
    lVar8 = ifstream_util_readTextFile(uVar7);
    if (lVar8 == 0) {
LAB_001026e5:
      iVar12 = 0;
      fprintf(_stderr,"Error: Failed to read contents of file %s\n",uVar7);
      bVar1 = true;
    }
    else {
      m_message = (adt_str_t *)adt_str_new_bytearray(lVar8);
      adt_bytearray_delete(lVar8);
      if (m_message == (adt_str_t *)0x0) goto LAB_001026e5;
      uVar9 = adt_str_cstr(m_message);
      lVar8 = dtl_json_load_cstr(uVar9);
      if (lVar8 == 0) {
        bVar1 = false;
        fprintf(_stderr,"Error: JSON data validation error while parsing %s\n",uVar7);
        iVar12 = -1;
      }
      else {
        dtl_dv_dec_ref(lVar8);
        bVar1 = true;
        iVar12 = 0;
      }
    }
    if (!bVar1) goto switchD_0010268f_default;
  }
  if (((m_message == (adt_str_t *)0x0) || (m_connect_resource_type == '\0')) ||
     (m_connect_resource_type == '\x05')) {
    if (((m_message == (adt_str_t *)0x0) && (m_display_version == '\0')) && (m_display_help == '\0')
       ) {
      puts("No message to send");
    }
    goto switchD_0010268f_default;
  }
  pcVar11 = (char *)adt_str_cstr(m_connect_address);
  if (pcVar11 == (char *)0x0) {
    __assert_fail("address != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_control/src/apx_control_main.c"
                  ,0xb4,"int main(int, char **)");
  }
  switch(m_connect_resource_type) {
  case '\x01':
    break;
  case '\x02':
    addressFamily = '\n';
    goto LAB_00102754;
  case '\x03':
    connect_and_send_message_unix(pcVar11);
    goto switchD_0010268f_default;
  case '\x04':
    if ((*pcVar11 != '\0') && (iVar6 = strcmp(pcVar11,"localhost"), iVar6 != 0)) {
      fprintf(_stderr,"Error: Unsupported connection name \"%s\"\n",pcVar11);
      iVar12 = -1;
      goto switchD_0010268f_default;
    }
    pcVar11 = "127.0.0.1";
    break;
  default:
    goto switchD_0010268f_default;
  }
  addressFamily = '\x02';
LAB_00102754:
  connect_and_send_message_tcp(pcVar11,m_connect_port,addressFamily);
switchD_0010268f_default:
  if (m_connect_address != (adt_str_t *)0x0) {
    adt_str_delete();
  }
  if (m_message != (adt_str_t *)0x0) {
    adt_str_delete();
  }
  if (m_input_file_path != (adt_str_t *)0x0) {
    adt_str_delete();
  }
  return iVar12;
}

Assistant:

int main(int argc, char **argv)
{
   m_connect_port = connect_port_default;
   int retval = 0;
   argparse_result_t result = argparse_exec(argc, (const char**) argv, argparse_cbk);
   if (result == ARGPARSE_SUCCESS)
   {
#ifdef _WIN32
      if (init_wsa() != 0)
      {
         int err = WSAGetLastError();
         fprintf(stderr, "WSAStartup failed with error: %d\n", err);
         retval = 1;
         goto SHUTDOWN;
      }
#endif
      if (m_display_version)
      {
         print_version();
      }
      if (m_display_help)
      {
         print_usage(argv[0]);
      }
      else
      {
         if (m_connect_resource_type == APX_RESOURCE_TYPE_UNKNOWN)
         {
            uint16_t dummy_port;
            m_connect_resource_type = apx_parse_resource_name(m_connect_address_default, &m_connect_address, &dummy_port);
            (void) dummy_port;
            assert( (m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR) );
         }
         if (m_input_file_path != 0)
         {
            const char *input_file_path = adt_str_cstr(m_input_file_path);
            result = read_message_from_file(input_file_path);

            if (result != APX_NO_ERROR)
            {
               fprintf(stderr, "Error: Failed to read contents of file %s\n", input_file_path);
            }
            else
            {
               dtl_dv_t *dv = dtl_json_load_cstr(adt_str_cstr(m_message));
               if (dv == 0)
               {
                  fprintf(stderr, "Error: JSON data validation error while parsing %s\n", input_file_path);
                  retval = -1;
                  goto SHUTDOWN;
               }
               else
               {
                  dtl_dec_ref(dv);
               }
            }
         }
         else
         {
            if (m_name != 0)
            {
               if (m_value == 0)
               {
                  printf("Error: missing value argument\n");
                  print_usage(argv[0]);
                  goto SHUTDOWN;
               }
               else
               {
                  result = build_json_message(m_name, m_value);
                  if (result != ADT_NO_ERROR)
                  {
                     retval = -1;
                     goto SHUTDOWN;
                  }
               }
            }
         }
         if ( (m_message != 0) && (m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR) )
         {
            const char *address;
            address = adt_str_cstr(m_connect_address);
            assert(address != 0);
            switch(m_connect_resource_type)
            {
            case APX_RESOURCE_TYPE_IPV4: //fall-trough
               connect_and_send_message_tcp(address, m_connect_port, AF_INET);
               break;
            case APX_RESOURCE_TYPE_IPV6:
               connect_and_send_message_tcp(address, m_connect_port, AF_INET6);
               break;
            case APX_RESOURCE_TYPE_FILE:
   #ifdef _WIN32
               printf("UNIX domain socket path not supported in Windows\n");
   #else
               connect_and_send_message_unix(address);
   #endif
               break;
            case APX_RESOURCE_TYPE_NAME:
               if ( (strlen(address) == 0) || (strcmp(address, "localhost") == 0) )
               {
                  connect_and_send_message_tcp("127.0.0.1", m_connect_port, AF_INET);
               }
               else
               {
                  fprintf(stderr, "Error: Unsupported connection name \"%s\"\n", address);
                  retval = -1;
               }
               break;
            }
         }
         else if (m_message == 0)
         {
            if (!m_display_version && !m_display_help)
            {
               printf("No message to send\n");
            }
         }
      }
   }
   else
   {
      printf("Error parsing argument (%d)\n", (int) result);
      print_usage(argv[0]);
   }
SHUTDOWN:
   application_cleanup();
   return retval;
}